

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O0

void tcmalloc::ThreadCache::GlobalInit(void)

{
  int local_c;
  int cl;
  
  if (((global_inited ^ 0xff) & 1) == 0) {
    __assert_fail("!global_inited",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                  ,0xdf,"static void tcmalloc::ThreadCache::GlobalInit()");
  }
  for (local_c = 1; local_c < 0x56; local_c = local_c + 1) {
    CentralFreelist::Init((CentralFreelist *)(central_freelists + (long)local_c * 0x4f0),local_c);
  }
  pthread_key_create(&spec_key,DestroyThreadCache);
  CacheListInit((ThreadCache *)cache_list);
  next_cache_steal = cache_list;
  global_inited = 1;
  return;
}

Assistant:

static void GlobalInit() {
        assert(!global_inited);
        for (int cl = 1; cl < kMaxClass; ++cl) {
            central_freelists[cl].Init(cl);
        }
        pthread_key_create(&spec_key, DestroyThreadCache);
        CacheListInit(&cache_list);
        next_cache_steal = &cache_list;
        global_inited = true;
    }